

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FormatString.hpp
# Opt level: O0

void Diligent::
     FormatStrSS<std::__cxx11::stringstream,char[37],char_const*,char[38],unsigned_int,char[5],unsigned_int,char[31],unsigned_int>
               (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *ss,
               char (*FirstArg) [37],char **RestArgs,char (*RestArgs_1) [38],uint *RestArgs_2,
               char (*RestArgs_3) [5],uint *RestArgs_4,char (*RestArgs_5) [31],uint *RestArgs_6)

{
  char (*RestArgs_local_3) [5];
  uint *RestArgs_local_2;
  char (*RestArgs_local_1) [38];
  char **RestArgs_local;
  char (*FirstArg_local) [37];
  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *ss_local;
  
  FormatStrSS<std::__cxx11::stringstream,char[37]>(ss,FirstArg);
  FormatStrSS<std::__cxx11::stringstream,char_const*,char[38],unsigned_int,char[5],unsigned_int,char[31],unsigned_int>
            (ss,RestArgs,RestArgs_1,RestArgs_2,RestArgs_3,RestArgs_4,RestArgs_5,RestArgs_6);
  return;
}

Assistant:

void FormatStrSS(SSType& ss, const FirstArgType& FirstArg, const RestArgsType&... RestArgs)
{
    FormatStrSS(ss, FirstArg);
    FormatStrSS(ss, RestArgs...); // recursive call using pack expansion syntax
}